

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O2

void __thiscall
btAxisSweep3Internal<unsigned_short>::updateHandle
          (btAxisSweep3Internal<unsigned_short> *this,unsigned_short handle,btVector3 *aabbMin,
          btVector3 *aabbMax,btDispatcher *dispatcher)

{
  ushort edge;
  ushort edge_00;
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  Edge *pEVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  undefined6 in_register_00000032;
  int iVar9;
  unsigned_short max [3];
  unsigned_short min [3];
  Edge **local_40;
  Handle *local_38;
  
  local_38 = this->m_pHandles + (CONCAT62(in_register_00000032,handle) & 0xffffffff);
  quantize(this,min,aabbMin,0);
  quantize(this,max,aabbMax,1);
  local_40 = this->m_pEdges;
  for (lVar8 = -3; lVar8 != 0; lVar8 = lVar8 + 1) {
    edge = local_38->m_maxEdges[lVar8];
    edge_00 = local_38->m_maxEdges[lVar8 + 3];
    uVar1 = *(ushort *)((long)&local_40 + lVar8 * 2);
    pEVar5 = local_40[lVar8 + 3];
    uVar2 = pEVar5[edge].m_pos;
    uVar3 = min[lVar8];
    uVar4 = pEVar5[edge_00].m_pos;
    pEVar5[edge].m_pos = uVar1;
    iVar9 = (uint)uVar1 - (uint)uVar2;
    pEVar5[edge_00].m_pos = min[lVar8];
    iVar6 = (int)lVar8;
    if (iVar9 < 0) {
      sortMinDown(this,iVar6 + 3,edge,dispatcher,true);
    }
    iVar7 = (uint)uVar3 - (uint)uVar4;
    if (0 < iVar7) {
      sortMaxUp(this,iVar6 + 3,edge_00,dispatcher,true);
    }
    if (0 < iVar9) {
      sortMinUp(this,iVar6 + 3,edge,dispatcher,true);
    }
    if (iVar7 < 0) {
      sortMaxDown(this,iVar6 + 3,edge_00,dispatcher,true);
    }
  }
  return;
}

Assistant:

void btAxisSweep3Internal<BP_FP_INT_TYPE>::updateHandle(BP_FP_INT_TYPE handle, const btVector3& aabbMin,const btVector3& aabbMax,btDispatcher* dispatcher)
{
//	btAssert(bounds.IsFinite());
	//btAssert(bounds.HasVolume());

	Handle* pHandle = getHandle(handle);

	// quantize the new bounds
	BP_FP_INT_TYPE min[3], max[3];
	quantize(min, aabbMin, 0);
	quantize(max, aabbMax, 1);

	// update changed edges
	for (int axis = 0; axis < 3; axis++)
	{
		BP_FP_INT_TYPE emin = pHandle->m_minEdges[axis];
		BP_FP_INT_TYPE emax = pHandle->m_maxEdges[axis];

		int dmin = (int)min[axis] - (int)m_pEdges[axis][emin].m_pos;
		int dmax = (int)max[axis] - (int)m_pEdges[axis][emax].m_pos;

		m_pEdges[axis][emin].m_pos = min[axis];
		m_pEdges[axis][emax].m_pos = max[axis];

		// expand (only adds overlaps)
		if (dmin < 0)
			sortMinDown(axis, emin,dispatcher,true);

		if (dmax > 0)
			sortMaxUp(axis, emax,dispatcher,true);

		// shrink (only removes overlaps)
		if (dmin > 0)
			sortMinUp(axis, emin,dispatcher,true);

		if (dmax < 0)
			sortMaxDown(axis, emax,dispatcher,true);

#ifdef DEBUG_BROADPHASE
	debugPrintAxis(axis);
#endif //DEBUG_BROADPHASE
	}

	
}